

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O3

Maybe<kj::Own<const_kj::ReadableDirectory,_std::nullptr_t>_> __thiscall
kj::anon_unknown_59::InMemoryDirectory::tryOpenSubdir(InMemoryDirectory *this,PathPtr path)

{
  long in_RCX;
  EntryImpl *entry;
  _func_int **pp_Var1;
  undefined8 *puVar2;
  ReadableDirectory *extraout_RDX;
  ReadableDirectory *pRVar3;
  char *pcVar4;
  ReadableDirectory *extraout_RDX_00;
  ReadableDirectory *extraout_RDX_01;
  Mutex *this_00;
  Maybe<kj::Own<const_kj::ReadableDirectory,_std::nullptr_t>_> MVar5;
  StringPtr name;
  StringPtr name_00;
  Locked<const_kj::(anonymous_namespace)::InMemoryDirectory::Impl> lock;
  undefined1 local_48 [16];
  Mutex *local_38;
  Locked<const_kj::(anonymous_namespace)::InMemoryDirectory::Impl> *local_30;
  
  puVar2 = (undefined8 *)path.parts.size_;
  name_00.content.ptr =
       (Locked<const_kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)path.parts.ptr;
  if (in_RCX == 1) {
    this_00 = (Mutex *)&name_00.content.ptr[1].ptr;
    local_48[0] = 0;
    kj::_::Mutex::lock(this_00,1);
    local_30 = name_00.content.ptr + 3;
    if (puVar2[1] == 0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (char *)*puVar2;
    }
    name.content.size_ = (size_t)pcVar4;
    name.content.ptr = (char *)local_30;
    local_38 = this_00;
    Impl::tryGetEntry((Impl *)local_48,name);
    if (CONCAT71(local_48._1_7_,local_48[0]) == 0) {
      (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode = (_func_int **)0x0;
      (this->super_AtomicRefcounted).super_Disposer._vptr_Disposer = (_func_int **)0x0;
    }
    else {
      MVar5 = asDirectory(this,name_00.content.ptr,(EntryImpl *)&stack0xffffffffffffffc8);
      pRVar3 = MVar5.ptr.ptr;
      this_00 = local_38;
      if (local_38 == (Mutex *)0x0) goto LAB_001ef6df;
    }
    kj::_::Mutex::unlock(this_00,SHARED,(Waiter *)0x0);
    pRVar3 = extraout_RDX_01;
  }
  else if (in_RCX == 0) {
    (*(code *)(name_00.content.ptr)->mutex[1].waitersTail)(local_48,name_00.content.ptr);
    pp_Var1 = (_func_int **)local_48._8_8_;
    if ((_func_int **)local_48._8_8_ != (_func_int **)0x0) {
      pp_Var1 = (_func_int **)CONCAT71(local_48._1_7_,local_48[0]);
    }
    (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode = pp_Var1;
    (this->super_AtomicRefcounted).super_Disposer._vptr_Disposer = (_func_int **)local_48._8_8_;
    pRVar3 = extraout_RDX;
  }
  else {
    if (puVar2[1] == 0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (char *)*puVar2;
    }
    name_00.content.size_ = (size_t)pcVar4;
    MVar5 = tryGetParent((InMemoryDirectory *)local_48,name_00);
    pRVar3 = MVar5.ptr.ptr;
    if ((_func_int **)local_48._8_8_ == (_func_int **)0x0) {
      (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode = (_func_int **)0x0;
      (this->super_AtomicRefcounted).super_Disposer._vptr_Disposer = (_func_int **)0x0;
    }
    else {
      (**(code **)(*(_func_int **)local_48._8_8_ + 0x58))
                (this,local_48._8_8_,puVar2 + 3,in_RCX + -1);
      (*(code *)**(undefined8 **)CONCAT71(local_48._1_7_,local_48[0]))
                ((undefined8 *)CONCAT71(local_48._1_7_,local_48[0]),
                 local_48._8_8_ + *(long *)(*(_func_int **)local_48._8_8_ + -0x10));
      pRVar3 = extraout_RDX_00;
    }
  }
LAB_001ef6df:
  MVar5.ptr.ptr = pRVar3;
  MVar5.ptr.disposer = (Disposer *)this;
  return (Maybe<kj::Own<const_kj::ReadableDirectory,_std::nullptr_t>_>)MVar5.ptr;
}

Assistant:

Maybe<Own<const ReadableDirectory>> tryOpenSubdir(PathPtr path) const override {
    if (path.size() == 0) {
      return clone();
    } else if (path.size() == 1) {
      auto lock = impl.lockShared();
      KJ_IF_SOME(entry, lock->tryGetEntry(path[0])) {
        return asDirectory(lock, entry);
      } else {
        return kj::none;
      }
    }